

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

int proxy_start(proxy_handle *ph)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  
  plVar1 = (long *)ph->priv;
  lVar7 = 0;
  for (uVar6 = 0; uVar4 = (ulong)(int)plVar1[0x107], (long)uVar6 < (long)uVar4; uVar6 = uVar6 + 1) {
    iVar2 = proxy_conn_start((proxy_conn_handle *)(*plVar1 + lVar7));
    if (iVar2 < 0) {
      pcVar5 = strerror(-iVar2);
      proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start proxy connection #%d (%d): %s\n",
                uVar6 & 0xffffffff,(ulong)(uint)-iVar2,pcVar5);
      goto LAB_00104f87;
    }
    lVar7 = lVar7 + 0x48;
  }
  lVar7 = -0x30;
  uVar6 = 0;
  do {
    if ((long)(int)uVar4 <= (long)uVar6) {
      mutex_lock((mutex_handle *)(plVar1 + 0x10e));
      *(int *)((long)plVar1 + 0x83c) = (int)plVar1[0x107];
      mutex_unlock((mutex_handle *)(plVar1 + 0x10e));
      proxy_update_registration(ph);
      iVar3 = registration_service_start((registration_service_handle *)(plVar1 + 0x111),&ph->conf);
      iVar2 = 0;
      if (iVar3 < 0) {
        pcVar5 = strerror(-iVar3);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start registration service (%d): %s\n",
                  (ulong)(uint)-iVar3,pcVar5);
        iVar2 = iVar3;
LAB_00104f7a:
        for (; 0 < (long)uVar6; uVar6 = uVar6 - 1) {
          worker_join((worker_handle *)(plVar1[0x103] + lVar7));
          lVar7 = lVar7 + -0x50;
        }
        uVar6 = (ulong)*(uint *)(plVar1 + 0x107);
LAB_00104f87:
        lVar7 = (uVar6 & 0xffffffff) * 0x48;
        while( true ) {
          lVar7 = lVar7 + -0x48;
          if ((int)uVar6 < 1) break;
          proxy_conn_stop((proxy_conn_handle *)(*plVar1 + lVar7));
          uVar6 = (ulong)((int)uVar6 - 1);
        }
      }
      return iVar2;
    }
    iVar2 = worker_start((worker_handle *)(plVar1[0x103] + lVar7 + 0x50));
    if (iVar2 < 0) {
      pcVar5 = strerror(-iVar2);
      proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start proxy worker #%d (%d): %s\n",uVar6 & 0xffffffff,
                (ulong)(uint)-iVar2,pcVar5);
      goto LAB_00104f7a;
    }
    uVar6 = uVar6 + 1;
    uVar4 = (ulong)*(uint *)(plVar1 + 0x107);
    lVar7 = lVar7 + 0x50;
  } while( true );
}

Assistant:

int proxy_start(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int ret;
	int i;

	for (i = 0; i < priv->num_clients; i++) {
		ret = proxy_conn_start(&priv->clients[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to start proxy connection #%d (%d): %s\n",
				  i, -ret, strerror(-ret));
			goto proxy_start_exit_early;
		}
	}

	for (i = 0; i < priv->num_clients; i++) {
		ret = worker_start(&priv->client_workers[i].worker);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to start proxy worker #%d (%d): %s\n",
				  i, -ret, strerror(-ret));
			goto proxy_start_exit;
		}
	}

	mutex_lock(&priv->usable_clients_mutex);
	priv->usable_clients = priv->num_clients;
	mutex_unlock(&priv->usable_clients_mutex);

	proxy_update_registration(ph);
	ret = registration_service_start(&priv->reg_service, &ph->conf);
	if (ret < 0) {
		proxy_log(ph, LOG_LEVEL_FATAL,
			  "Failed to start registration service (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_start_exit;
	}

	return 0;

proxy_start_exit:
	for (i--; i >= 0; i--)
		worker_join(&priv->client_workers[i].worker);

	i = priv->num_clients;

proxy_start_exit_early:
	for (i--; i >= 0; i--)
		proxy_conn_stop(&priv->clients[i]);

	return ret;
}